

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::BinaryReadError::BinaryReadError
          (BinaryReadError *this,string *filename,size_t offset,CStringRef message)

{
  Error::Error(&this->super_Error,message,-1);
  *(undefined ***)&(this->super_Error).super_RuntimeError = &PTR__BinaryReadError_00188d38;
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  this->offset_ = offset;
  return;
}

Assistant:

BinaryReadError(
      const std::string &filename, std::size_t offset, fmt::CStringRef message)
  : Error(message), filename_(filename), offset_(offset) {}